

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O0

bool duckdb::PushVarcharCollation
               (ClientContext *context,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *source
               ,LogicalType *sql_type,CollationType type)

{
  LogicalTypeId LVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  ulong uVar6;
  Catalog *params_1;
  size_type sVar7;
  CollateCatalogEntry *pCVar8;
  reference pvVar9;
  undefined8 uVar10;
  int in_ECX;
  LogicalType *in_RDX;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> function;
  FunctionBinder function_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  CollateCatalogEntry *collation_entry_1;
  reference_wrapper<duckdb::CollateCatalogEntry> *entry;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> *__range1_1;
  CollateCatalogEntry *collation_entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collation_argument;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collations;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  Catalog *catalog;
  string collation;
  string str_collation;
  ClientContext *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffb68;
  ClientContext *in_stack_fffffffffffffb70;
  ScalarFunction *in_stack_fffffffffffffb78;
  optional_idx in_stack_fffffffffffffb80;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  undefined5 in_stack_fffffffffffffbf0;
  DBConfig *in_stack_fffffffffffffbf8;
  optional_ptr<duckdb::Binder,_true> in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffcdf;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffce0;
  ScalarFunction *in_stack_fffffffffffffce8;
  FunctionBinder *in_stack_fffffffffffffcf0;
  optional_ptr<duckdb::Binder,_true> in_stack_fffffffffffffcf8;
  undefined1 local_2a0 [40];
  tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  local_278;
  __normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
  local_270;
  undefined1 *local_268;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_260;
  undefined1 local_258 [23];
  undefined1 local_241;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  reference_wrapper<duckdb::CollateCatalogEntry> *local_1d8;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> local_1d0;
  optional_idx local_1b8;
  QueryErrorContext local_1b0;
  allocator local_1a1;
  string local_1a0 [32];
  CollateCatalogEntry *local_180;
  reference local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  undefined1 *local_160;
  undefined1 local_120 [31];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  undefined1 local_c0 [24];
  Catalog *local_a8;
  undefined4 local_9c;
  string local_98 [48];
  string local_68 [32];
  string local_48 [36];
  int local_24;
  byte local_1;
  
  local_24 = in_ECX;
  LVar1 = LogicalType::id(in_RDX);
  if (LVar1 == VARCHAR) {
    StringType::GetCollation_abi_cxx11_((LogicalType *)in_stack_fffffffffffffb68._M_cur);
    ::std::__cxx11::string::string(local_68);
    uVar6 = ::std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      ::std::__cxx11::string::operator=(local_68,local_48);
    }
    else {
      in_stack_fffffffffffffbf8 = DBConfig::GetConfig((ClientContext *)0xe6c9f6);
      ::std::__cxx11::string::operator=
                (local_68,(string *)&(in_stack_fffffffffffffbf8->options).collation);
    }
    StringUtil::Lower(in_stack_fffffffffffffba8);
    ::std::__cxx11::string::operator=(local_68,local_98);
    ::std::__cxx11::string::~string(local_98);
    uVar6 = ::std::__cxx11::string::empty();
    if (((((uVar6 & 1) != 0) ||
         (uVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                                    ,(char *)in_stack_fffffffffffffb58), (bool)uVar2)) ||
        (uVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                                   (char *)in_stack_fffffffffffffb58), (bool)uVar3)) ||
       (uVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                                  (char *)in_stack_fffffffffffffb58), (bool)uVar4)) {
      local_1 = 0;
      local_9c = 1;
    }
    else {
      params_1 = Catalog::GetSystemCatalog((ClientContext *)0xe6cb3f);
      local_a8 = params_1;
      StringUtil::Lower(in_stack_fffffffffffffba8);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_100,".",&local_101);
      StringUtil::Split(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      ::std::__cxx11::string::~string(local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string(local_e0);
      vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::vector
                ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> *)0xe6cbf6);
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0xe6cc03);
      local_160 = local_c0;
      local_168._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb58);
      local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb58);
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffb58), bVar5) {
        local_178 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_168);
        sVar7 = ::std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                        (key_type *)in_stack_fffffffffffffb58);
        if (sVar7 == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1a0,"main",&local_1a1);
          optional_idx::optional_idx(&local_1b8);
          QueryErrorContext::QueryErrorContext(&local_1b0,local_1b8);
          pCVar8 = Catalog::GetEntry<duckdb::CollateCatalogEntry>
                             ((Catalog *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                              (string *)in_stack_fffffffffffffb68._M_cur,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                              (QueryErrorContext)in_stack_fffffffffffffb80.index);
          ::std::__cxx11::string::~string(local_1a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          local_180 = pCVar8;
          if ((pCVar8->combinable & 1U) == 0) {
            bVar5 = ::std::
                    vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                    ::empty((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                             *)in_stack_fffffffffffffb70);
            if (!bVar5) {
              pvVar9 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                 (in_stack_fffffffffffffba0);
              pCVar8 = ::std::reference_wrapper<duckdb::CollateCatalogEntry>::get(pvVar9);
              if ((pCVar8->combinable & 1U) == 0) {
                local_241 = 1;
                uVar10 = __cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1f8,"Cannot combine collation types \"%s\" and \"%s\"",&local_1f9);
                pvVar9 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                   (in_stack_fffffffffffffba0);
                pCVar8 = ::std::reference_wrapper<duckdb::CollateCatalogEntry>::get(pvVar9);
                ::std::__cxx11::string::string
                          (local_220,
                           (string *)
                           &(pCVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                            name);
                ::std::__cxx11::string::string
                          (local_240,
                           (string *)
                           &(local_180->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
                            .name);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          ((BinderException *)in_stack_fffffffffffffc00.ptr,
                           (string *)in_stack_fffffffffffffbf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffffbf0)))
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            params_1);
                local_241 = 0;
                __cxa_throw(uVar10,&BinderException::typeinfo,BinderException::~BinderException);
              }
            }
            in_stack_fffffffffffffb70 = (ClientContext *)(local_258 + 8);
            ::std::reference_wrapper<duckdb::CollateCatalogEntry>::
            reference_wrapper<duckdb::CollateCatalogEntry&,void,duckdb::CollateCatalogEntry*>
                      ((reference_wrapper<duckdb::CollateCatalogEntry> *)
                       CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       (CollateCatalogEntry *)in_stack_fffffffffffffb58);
            ::std::
            vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            ::push_back((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                        (value_type *)in_stack_fffffffffffffb58);
          }
          else {
            local_1d0.
            super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)::std::
                          vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                          ::begin((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                                   *)in_stack_fffffffffffffb58);
            __gnu_cxx::
            __normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>const*,std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>>
            ::__normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>*>
                      ((__normal_iterator<const_std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       (__normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
                        *)in_stack_fffffffffffffb58);
            in_stack_fffffffffffffba0 = &local_1d0;
            ::std::reference_wrapper<duckdb::CollateCatalogEntry>::
            reference_wrapper<duckdb::CollateCatalogEntry&,void,duckdb::CollateCatalogEntry*>
                      ((reference_wrapper<duckdb::CollateCatalogEntry> *)
                       CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       (CollateCatalogEntry *)in_stack_fffffffffffffb58);
            local_1d8 = (reference_wrapper<duckdb::CollateCatalogEntry> *)
                        ::std::
                        vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                        ::insert((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                                 (const_iterator)in_stack_fffffffffffffb68._M_cur,
                                 (value_type *)in_stack_fffffffffffffb58);
          }
          pVar11 = ::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffb70,
                            (value_type *)in_stack_fffffffffffffb68._M_cur);
          in_stack_fffffffffffffb68._M_cur =
               (__node_type *)
               pVar11.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
          in_stack_fffffffffffffb67 = pVar11.second;
          local_260._M_cur = in_stack_fffffffffffffb68._M_cur;
          local_258[0] = in_stack_fffffffffffffb67;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_168);
      }
      local_268 = local_120;
      local_270._M_current =
           (reference_wrapper<duckdb::CollateCatalogEntry> *)
           ::std::
           vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
           ::begin((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                    *)in_stack_fffffffffffffb58);
      local_278.
      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )::std::
             vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
             ::end((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                    *)in_stack_fffffffffffffb58);
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                                (__normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
                                 *)in_stack_fffffffffffffb58), bVar5) {
        local_2a0._32_8_ =
             __gnu_cxx::
             __normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
             ::operator*(&local_270);
        local_2a0._24_8_ =
             ::std::reference_wrapper<duckdb::CollateCatalogEntry>::get
                       ((reference_wrapper<duckdb::CollateCatalogEntry> *)local_2a0._32_8_);
        if (((((CollateCatalogEntry *)local_2a0._24_8_)->combinable & 1U) == 0) && (local_24 == 1))
        {
          local_1 = 0;
          goto LAB_00e6d318;
        }
        in_stack_fffffffffffffb58 = (ClientContext *)local_2a0;
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)0xe6d1b5);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                    (value_type *)in_stack_fffffffffffffb58);
        FunctionBinder::FunctionBinder
                  ((FunctionBinder *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb58);
        ScalarFunction::ScalarFunction
                  ((ScalarFunction *)in_stack_fffffffffffffb80.index,in_stack_fffffffffffffb78);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffb58);
        optional_ptr<duckdb::Binder,_true>::optional_ptr
                  ((optional_ptr<duckdb::Binder,_true> *)&stack0xfffffffffffffc00,(Binder *)0x0);
        FunctionBinder::BindScalarFunction
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                   (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcf8);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)0xe6d264);
        ScalarFunction::~ScalarFunction
                  ((ScalarFunction *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffb58);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xe6d293);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)0xe6d2a0);
        __gnu_cxx::
        __normal_iterator<std::reference_wrapper<duckdb::CollateCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>_>
        ::operator++(&local_270);
      }
      local_1 = 1;
LAB_00e6d318:
      local_9c = 1;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0xe6d325);
      vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::~vector
                ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> *)0xe6d332);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0xe6d33f);
    }
    ::std::__cxx11::string::~string(local_68);
    ::std::__cxx11::string::~string(local_48);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool PushVarcharCollation(ClientContext &context, unique_ptr<Expression> &source, const LogicalType &sql_type,
                          CollationType type) {
	if (sql_type.id() != LogicalTypeId::VARCHAR) {
		// only VARCHAR columns require collation
		return false;
	}
	// replace default collation with system collation
	auto str_collation = StringType::GetCollation(sql_type);
	string collation;
	if (str_collation.empty()) {
		collation = DBConfig::GetConfig(context).options.collation;
	} else {
		collation = str_collation;
	}
	collation = StringUtil::Lower(collation);
	// bind the collation
	if (collation.empty() || collation == "binary" || collation == "c" || collation == "posix") {
		// no collation or binary collation: skip
		return false;
	}
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto splits = StringUtil::Split(StringUtil::Lower(collation), ".");
	vector<reference<CollateCatalogEntry>> entries;
	unordered_set<string> collations;
	for (auto &collation_argument : splits) {
		if (collations.count(collation_argument)) {
			// we already applied this collation
			continue;
		}
		auto &collation_entry = catalog.GetEntry<CollateCatalogEntry>(context, DEFAULT_SCHEMA, collation_argument);
		if (collation_entry.combinable) {
			entries.insert(entries.begin(), collation_entry);
		} else {
			if (!entries.empty() && !entries.back().get().combinable) {
				throw BinderException("Cannot combine collation types \"%s\" and \"%s\"", entries.back().get().name,
				                      collation_entry.name);
			}
			entries.push_back(collation_entry);
		}
		collations.insert(collation_argument);
	}
	for (auto &entry : entries) {
		auto &collation_entry = entry.get();
		if (!collation_entry.combinable && type == CollationType::COMBINABLE_COLLATIONS) {
			// not a combinable collation - ignore
			return false;
		}
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(source));

		FunctionBinder function_binder(context);
		auto function = function_binder.BindScalarFunction(collation_entry.function, std::move(children));
		source = std::move(function);
	}
	return true;
}